

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O3

void scalar_select(t_gobj *z,_glist *owner,int state)

{
  t_pd s;
  t_template *template;
  t_symbol *s_00;
  char *s_01;
  t_atom at;
  t_atom local_48;
  t_gobj *local_38;
  int local_30;
  t_gstub *local_28;
  
  s = z[1].g_pd;
  local_28 = owner->gl_stub;
  local_48.a_w.w_symbol = (t_symbol *)&local_38;
  local_30 = owner->gl_valid;
  local_28->gs_refcount = local_28->gs_refcount + 1;
  local_48.a_type = A_POINTER;
  local_38 = z;
  template = template_findbyname((t_symbol *)s);
  if (template != (t_template *)0x0) {
    s_01 = "select";
    if (state == 0) {
      s_01 = "deselect";
    }
    s_00 = gensym(s_01);
    template_notify(template,s_00,1,&local_48);
  }
  if (local_28 != (t_gstub *)0x0) {
    gstub_dis(local_28);
    local_28 = (t_gstub *)0x0;
  }
  scalar_drawselectrect((t_scalar *)z,owner,state);
  return;
}

Assistant:

static void scalar_select(t_gobj *z, t_glist *owner, int state)
{
    t_scalar *x = (t_scalar *)z;
    t_template *tmpl;
    t_symbol *templatesym = x->sc_template;
    t_atom at;
    t_gpointer gp;
    gpointer_init(&gp);
    gpointer_setglist(&gp, owner, x);
    SETPOINTER(&at, &gp);
    if ((tmpl = template_findbyname(templatesym)))
        template_notify(tmpl, (state ? gensym("select") : gensym("deselect")),
            1, &at);
    gpointer_unset(&gp);
    scalar_drawselectrect(x, owner, state);
}